

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

bool Js::CompoundString::Block::ShouldAppendChars
               (CharCount appendCharLength,uint additionalSizeForPointerAppend)

{
  uint additionalSizeForPointerAppend_local;
  CharCount appendCharLength_local;
  
  return (ulong)appendCharLength <= (ulong)additionalSizeForPointerAppend + 0x10 >> 1;
}

Assistant:

bool CompoundString::Block::ShouldAppendChars(
        const CharCount appendCharLength,
        const uint additionalSizeForPointerAppend)
    {
        // Append characters instead of pointers when it would save space. Add some buffer as well, as flattening becomes more
        // expensive after the switch to pointer mode.
        //
        // 'additionalSizeForPointerAppend' should be provided when appending a pointer also involves creating a string object
        // or some other additional space (such as LiteralString, in which case this parameter should be sizeof(LiteralString)),
        // as that additional size also needs to be taken into account.
        return appendCharLength <= (sizeof(void *) * 2 + additionalSizeForPointerAppend) / sizeof(char16);
    }